

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::IncomingRpcMessage> * __thiscall
kj::Own<capnp::IncomingRpcMessage>::operator=
          (Own<capnp::IncomingRpcMessage> *this,Own<capnp::IncomingRpcMessage> *other)

{
  Disposer *object;
  Dispose_<capnp::IncomingRpcMessage,_true> *this_00;
  IncomingRpcMessage *pIVar1;
  Disposer *in_RDX;
  
  object = this->disposer;
  this_00 = (Dispose_<capnp::IncomingRpcMessage,_true> *)this->ptr;
  pIVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pIVar1;
  other->ptr = (IncomingRpcMessage *)0x0;
  if (this_00 != (Dispose_<capnp::IncomingRpcMessage,_true> *)0x0) {
    Disposer::Dispose_<capnp::IncomingRpcMessage,_true>::dispose
              (this_00,(IncomingRpcMessage *)object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }